

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O2

bool __thiscall HashTbl::Contains(HashTbl *this,LPCOLESTR prgch,int32 cch)

{
  bool bVar1;
  ULONG UVar2;
  Ident *pIVar3;
  
  UVar2 = CaseSensitiveComputeHash(prgch,prgch + cch);
  pIVar3 = (Ident *)(this->m_prgpidName + (this->m_luMask & UVar2));
  do {
    do {
      pIVar3 = pIVar3->m_pidNext;
      if (pIVar3 == (Ident *)0x0) goto LAB_00cde865;
    } while ((pIVar3->m_luHash != UVar2) || (pIVar3->m_cch != cch));
    bVar1 = CharsAreEqual((LPCOLESTR)&pIVar3->field_0x22,prgch + cch,prgch);
  } while (!bVar1);
LAB_00cde865:
  return pIVar3 != (Ident *)0x0;
}

Assistant:

bool HashTbl::Contains(_In_reads_(cch) LPCOLESTR prgch, int32 cch)
{
    uint32 luHash = CaseSensitiveComputeHash(prgch, prgch + cch);

    for (auto pid = m_prgpidName[luHash & m_luMask]; pid; pid = pid->m_pidNext)
    {
        if (pid->m_luHash == luHash && (int)pid->m_cch == cch &&
            HashTbl::CharsAreEqual(pid->m_sz, prgch + cch, prgch))
        {
            return true;
        }
    }

    return false;
}